

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_DP2ADD(Context *ctx)

{
  char local_158 [8];
  char scratch [64];
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char dst [64];
  Context *ctx_local;
  
  if (ctx->profile_supports_nv4 == 0) {
    make_ARB1_destarg_string(ctx,src0 + 0x38,0x40);
    make_ARB1_srcarg_string(ctx,0,src1 + 0x38,0x40);
    make_ARB1_srcarg_string(ctx,1,src2 + 0x38,0x40);
    make_ARB1_srcarg_string(ctx,2,scratch + 0x38,0x40);
    allocate_ARB1_scratch_reg_name(ctx,local_158,0x40);
    output_line(ctx,"MUL %s, %s, %s;",local_158,src1 + 0x38,src2 + 0x38);
    output_line(ctx,"ADD %s, %s.x, %s.y;",local_158,local_158,local_158);
    output_line(ctx,"ADD%s, %s.x, %s;",src0 + 0x38,local_158,scratch + 0x38);
    emit_ARB1_dest_modifiers(ctx);
  }
  else {
    emit_ARB1_opcode_dsss(ctx,"DP2A");
  }
  return;
}

Assistant:

EMIT_ARB1_OPCODE_UNIMPLEMENTED_FUNC(BEM)


static void emit_ARB1_DP2ADD(Context *ctx)
{
    if (support_nv4(ctx))  // nv4 has a built-in equivalent to DP2ADD.
        emit_ARB1_opcode_dsss(ctx, "DP2A");
    else
    {
        char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
        char src0[64]; make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));
        char src1[64]; make_ARB1_srcarg_string(ctx, 1, src1, sizeof (src1));
        char src2[64]; make_ARB1_srcarg_string(ctx, 2, src2, sizeof (src2));
        char scratch[64];

        // DP2ADD is:
        //  dst = (src0.r * src1.r) + (src0.g * src1.g) + src2.replicate_swiz
        allocate_ARB1_scratch_reg_name(ctx, scratch, sizeof (scratch));
        output_line(ctx, "MUL %s, %s, %s;", scratch, src0, src1);
        output_line(ctx, "ADD %s, %s.x, %s.y;", scratch, scratch, scratch);
        output_line(ctx, "ADD%s, %s.x, %s;", dst, scratch, src2);
        emit_ARB1_dest_modifiers(ctx);
    } // else
}